

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O1

void PrintGraph(ExpressionGraphContext *ctx,ExprBase *expression,InplaceStr name)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  SynBase *pSVar5;
  _func_int *p_Var6;
  ExprBase *pEVar7;
  ExprBase *pEVar8;
  uint uVar9;
  char *str;
  char *pcVar10;
  TypeBase *pTVar11;
  OutputContext *this;
  char *pcVar12;
  char *node;
  _func_int **pp_Var13;
  _func_int *p_Var14;
  ulong uVar15;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr name_05;
  InplaceStr name_06;
  InplaceStr name_07;
  InplaceStr name_08;
  InplaceStr name_09;
  InplaceStr name_10;
  InplaceStr name_11;
  InplaceStr name_12;
  InplaceStr name_13;
  InplaceStr name_14;
  InplaceStr name_15;
  
  pcVar10 = name.end;
  str = name.begin;
  pEVar8 = expression;
  if (0x400 < ctx->depth) {
    pcVar12 = "{...}";
LAB_001545e2:
    PrintIndented(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10);
    return;
  }
  if ((expression == (ExprBase *)0x0) || (expression->typeID != 0)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    if (pEVar8[1].typeID != 0) {
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprError()",str,pcVar10);
      if (pEVar8[1].typeID != 0) {
        uVar15 = 0;
        do {
          PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase[uVar15],"");
          uVar15 = uVar15 + 1;
        } while (uVar15 < pEVar8[1].typeID);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      this = ctx->output;
      pcVar10 = "}\n";
      uVar9 = 2;
LAB_00154685:
      OutputContext::Print(this,pcVar10,uVar9);
      return;
    }
    pcVar12 = "ExprError()";
    goto LAB_001545e2;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 1)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pp_Var13 = (_func_int **)pEVar8[1]._vptr_ExprBase[2];
    uVar15 = (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase + 3) - (int)pp_Var13);
    pcVar12 = "ExprErrorTypeMemberAccess(%.*s)";
    goto LAB_001546d4;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 2)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pcVar12 = "ExprVoid()";
    goto LAB_001545e2;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 3)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pp_Var13 = (_func_int **)0x1fdd84;
    if (pEVar8->field_0x29 != '\0') {
      pp_Var13 = (_func_int **)0x20c4d5;
    }
    pcVar12 = "ExprBoolLiteral(%s)";
LAB_0015475c:
    PrintIndented(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10,pp_Var13);
    return;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 4)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    if ((char)pEVar8->field_0x29 < ' ') {
      pcVar12 = "ExprCharacterLiteral(0x%02x)";
    }
    else {
      pcVar12 = "ExprCharacterLiteral(\'%c\')";
    }
    PrintIndented(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10);
    return;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 5)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    uVar15 = (ulong)pEVar8[1].typeID;
    pcVar12 = "ExprStringLiteral(\'%.*s\')";
    pp_Var13 = pEVar8[1]._vptr_ExprBase;
    goto LAB_001546d4;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 6)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pp_Var13 = pEVar8[1]._vptr_ExprBase;
    pcVar12 = "ExprIntegerLiteral(%lld)";
    goto LAB_0015475c;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 7)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    PrintIndented(ctx,pEVar8,(ExprBase *)"ExprRationalLiteral(%f)",(char *)pEVar8[1]._vptr_ExprBase,
                  str,pcVar10);
    return;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 8)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pp_Var13 = (_func_int **)pEVar8[1]._vptr_ExprBase[2];
    uVar15 = (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase + 3) - (int)pp_Var13);
    pcVar12 = "ExprTypeLiteral(%.*s)";
    goto LAB_001546d4;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 9)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pcVar12 = "ExprNullptrLiteral()";
    goto LAB_001545e2;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 10)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pp_Var13 = *(_func_int ***)(pEVar8[1]._vptr_ExprBase[7] + 0x40);
    uVar15 = (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase[7] + 0x48) - (int)pp_Var13);
    pcVar12 = "ExprFunctionIndexLiteral(%.*s: f%04x)";
    goto LAB_001546d4;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0xe)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    pcVar12 = "ExprPassthrough()";
    goto LAB_0015491a;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0xf)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 != (ExprBase *)0x0) {
    PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprArray()",str,pcVar10);
    for (pEVar8 = (ExprBase *)pEVar8[1]._vptr_ExprBase; pEVar8 != (ExprBase *)0x0;
        pEVar8 = pEVar8->next) {
      PrintGraph(ctx,pEVar8,"");
    }
    goto LAB_00154941;
  }
  if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x10)) {
    pEVar8 = (ExprBase *)0x0;
  }
  if (pEVar8 == (ExprBase *)0x0) {
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x11)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pcVar12 = "))--";
      if ((char)pEVar8[1].typeID != '\0') {
        pcVar12 = "))++";
      }
      pcVar12 = pcVar12 + 2;
      node = "ExprPostModify(%s)";
      goto LAB_00154a65;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x12)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      if (0xd < (ulong)pEVar8[1].typeID) {
        __assert_fail("!\"unknown category\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                      ,0x204,"void PrintGraph(ExpressionGraphContext &, ExprBase *, InplaceStr)");
      }
      pcVar12 = &DAT_001fd2c0 + *(int *)(&DAT_001fd2c0 + (ulong)pEVar8[1].typeID * 4);
      node = "ExprTypeCast(%s)";
      goto LAB_00154a65;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x13)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pcVar12 = GetOpName(*(SynUnaryOpType *)&pEVar8->field_0x2c);
      node = "ExprUnaryOp(%s)";
      goto LAB_00154a65;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x14)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pcVar12 = GetOpName(*(SynBinaryOpType *)&pEVar8->field_0x2c);
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprBinaryOp(%s)",str,pcVar10,pcVar12);
LAB_00154ae6:
      PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"lhs");
      pTVar11 = *(TypeBase **)&pEVar8[1].typeID;
      pcVar10 = "rhs";
      goto LAB_00154939;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x15)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pp_Var13 = *(_func_int ***)(*(long *)(pEVar8[1]._vptr_ExprBase[1] + 0x28) + 0x40);
      uVar15 = (ulong)(uint)(*(int *)(*(long *)(pEVar8[1]._vptr_ExprBase[1] + 0x28) + 0x48) -
                            (int)pp_Var13);
      pcVar12 = "ExprGetAddress(%.*s: v%04x)";
      goto LAB_001546d4;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x16)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pcVar12 = "ExprDereference()";
LAB_0015491a:
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10);
      goto LAB_0015492d;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x17)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pcVar12 = "ExprUnboxing()";
      goto LAB_0015491a;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x18)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      pcVar12 = "ExprConditional()";
LAB_00154ba8:
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10);
      PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"condition");
      PrintGraph(ctx,*(ExprBase **)&pEVar8[1].typeID,"trueBlock");
      pTVar11 = (TypeBase *)pEVar8[1].source;
      pcVar10 = "falseBlock";
      goto LAB_00154939;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x19)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprAssignment()",str,pcVar10);
      goto LAB_00154ae6;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x1a)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      if (*(long *)&pEVar8[1].typeID == 0) {
        pcVar12 = "ExprMemberAccess(%%missing%%)";
        goto LAB_0015491a;
      }
      lVar1 = *(long *)(*(long *)&pEVar8[1].typeID + 8);
      lVar2 = *(long *)(lVar1 + 0x28);
      uVar3 = *(undefined8 *)(lVar2 + 0x40);
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprMemberAccess(%.*s: v%04x)",str,pcVar10,
                      (ulong)(uint)(*(int *)(lVar2 + 0x48) - (int)uVar3),uVar3,
                      (ulong)*(uint *)(lVar1 + 0x40));
      goto LAB_0015492d;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x1b)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 != (ExprBase *)0x0) {
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprArrayIndex()",str,pcVar10);
      PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"value");
      pTVar11 = *(TypeBase **)&pEVar8[1].typeID;
      pcVar10 = "index";
      goto LAB_00154939;
    }
    if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x1c)) {
      pEVar8 = (ExprBase *)0x0;
    }
    if (pEVar8 == (ExprBase *)0x0) {
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x1d)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        pcVar12 = "ExprYield()";
        goto LAB_00154d28;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x1e)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        p_Var14 = pEVar8[1]._vptr_ExprBase[1];
        uVar3 = *(undefined8 *)(*(long *)(p_Var14 + 0x20) + 0x10);
        uVar4 = *(undefined8 *)(*(long *)(p_Var14 + 0x28) + 0x40);
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprVariableDefinition(%.*s %.*s: v%04x)",str,
                        pcVar10,(ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x20) + 0x18) -
                                             (int)uVar3),uVar3,
                        (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x28) + 0x48) - (int)uVar4),uVar4
                        ,(ulong)*(uint *)(p_Var14 + 0x40));
LAB_00154dd9:
        pTVar11 = *(TypeBase **)&pEVar8[1].typeID;
        pcVar10 = "initializer";
        goto LAB_00154939;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x1f)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprZeroInitialize()",str,pcVar10);
        pTVar11 = (TypeBase *)pEVar8[1]._vptr_ExprBase;
        pcVar10 = "address";
        goto LAB_00154939;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x20)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprArraySetup()",str,pcVar10);
        PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"lhs");
        goto LAB_00154dd9;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x21)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprVariableDefinitions()",str,pcVar10);
        for (pEVar8 = *(ExprBase **)&pEVar8[1].typeID; pEVar8 != (ExprBase *)0x0;
            pEVar8 = pEVar8->next) {
          PrintGraph(ctx,pEVar8,"");
        }
        goto LAB_00154941;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x22)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        pp_Var13 = *(_func_int ***)(pEVar8[1]._vptr_ExprBase[5] + 0x40);
        uVar15 = (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase[5] + 0x48) - (int)pp_Var13);
        pcVar12 = "ExprVariableAccess(%.*s: v%04x)";
LAB_001546d4:
        PrintIndented(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10,uVar15,pp_Var13);
        return;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x23)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        pp_Var13 = *(_func_int ***)(pEVar8[1]._vptr_ExprBase[7] + 0x40);
        uVar15 = (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase[7] + 0x48) - (int)pp_Var13);
        pcVar12 = "ExprFunctionContextAccess(%.*s: f%04x)";
        goto LAB_001546d4;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x24)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        pp_Var13 = pEVar8[1]._vptr_ExprBase;
        if (ctx->skipFunctionDefinitions == true) {
          pcVar12 = "";
          if (*(char *)(pp_Var13 + 0x29) != '\0') {
            pcVar12 = "prototype, ";
          }
          uVar3 = *(undefined8 *)(pp_Var13[7] + 0x40);
          PrintIndented(ctx,pEVar8,(ExprBase *)"ExprFunctionDefinition(%s%.*s: f%04x);",str,pcVar10,
                        pcVar12,(ulong)(uint)(*(int *)(pp_Var13[7] + 0x48) - (int)uVar3),uVar3,
                        (ulong)*(uint *)(pp_Var13 + 0xb));
          return;
        }
        if (*(char *)(pp_Var13 + 0x29) == '\0') {
          ctx->skipFunctionDefinitions = true;
          uVar3 = *(undefined8 *)(pp_Var13[7] + 0x40);
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprFunctionDefinition(%s%.*s: f%04x)",str,pcVar10
                          ,"",(ulong)(uint)(*(int *)(pp_Var13[7] + 0x48) - (int)uVar3),uVar3,
                          (ulong)*(uint *)(pp_Var13 + 0xb));
          PrintGraph(ctx,*(ExprBase **)&pEVar8[1].typeID,"contextArgument");
          name_01.end = "";
          name_01.begin = "arguments";
          PrintEnterBlock(ctx,name_01,(TypeBase *)0x0);
          for (pSVar5 = pEVar8[1].source; pSVar5 != (SynBase *)0x0;
              pSVar5 = (SynBase *)(pSVar5->pos).begin) {
            PrintGraph(ctx,(ExprBase *)pSVar5,"");
          }
          PrintLeaveBlock(ctx);
          PrintGraph(ctx,pEVar8[1].next,"coroutineStateRead");
          name_02.end = "";
          name_02.begin = "expressions";
          PrintEnterBlock(ctx,name_02,(TypeBase *)0x0);
          for (pEVar8 = *(ExprBase **)&pEVar8[1].listed; pEVar8 != (ExprBase *)0x0;
              pEVar8 = pEVar8->next) {
            PrintGraph(ctx,pEVar8,"");
          }
          PrintLeaveBlock(ctx);
          PrintLeaveBlock(ctx);
          ctx->skipFunctionDefinitions = false;
          return;
        }
        uVar3 = *(undefined8 *)(pp_Var13[7] + 0x40);
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprFunctionDefinition(%s%.*s: f%04x)",str,pcVar10,
                        "prototype, ",(ulong)(uint)(*(int *)(pp_Var13[7] + 0x48) - (int)uVar3),uVar3
                        ,(ulong)*(uint *)(pp_Var13 + 0xb));
        p_Var14 = pEVar8[1]._vptr_ExprBase[0x2a];
        if (p_Var14 != (_func_int *)0x0) {
          uVar3 = *(undefined8 *)(*(long *)(p_Var14 + 0x38) + 0x40);
          PrintIndented(ctx,*(undefined8 *)(p_Var14 + 0x28),(TypeBase *)"%.*s: f%04x",
                        "implementation","",
                        (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x38) + 0x48) - (int)uVar3),uVar3
                        ,(ulong)*(uint *)(p_Var14 + 0x58));
        }
        goto LAB_00154941;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x25)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 != (ExprBase *)0x0) {
        p_Var14 = pEVar8[1]._vptr_ExprBase[7];
        uVar3 = *(undefined8 *)(p_Var14 + 0x40);
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprGenericFunctionPrototype(%.*s: f%04x)",str,
                        pcVar10,(ulong)(uint)(*(int *)(p_Var14 + 0x48) - (int)uVar3),uVar3,
                        (ulong)*(uint *)(pEVar8[1]._vptr_ExprBase + 0xb));
        name_00.end = "";
        name_00.begin = "contextVariables";
        PrintEnterBlock(ctx,name_00,(TypeBase *)0x0);
        for (pEVar8 = *(ExprBase **)&pEVar8[1].typeID; pEVar8 != (ExprBase *)0x0;
            pEVar8 = pEVar8->next) {
          PrintGraph(ctx,pEVar8,"");
        }
        goto LAB_00155ccb;
      }
      if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x26)) {
        pEVar8 = (ExprBase *)0x0;
      }
      if (pEVar8 == (ExprBase *)0x0) {
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x27)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprFunctionOverloadSet()",str,pcVar10);
          name_03.end = "";
          name_03.begin = "functions";
          PrintEnterBlock(ctx,name_03,(TypeBase *)0x0);
          for (pp_Var13 = pEVar8[1]._vptr_ExprBase; pp_Var13 != (_func_int **)0x0;
              pp_Var13 = (_func_int **)pp_Var13[1]) {
            p_Var14 = *pp_Var13;
            uVar3 = *(undefined8 *)(*(long *)(p_Var14 + 0x38) + 0x40);
            PrintIndented(ctx,*(undefined8 *)(p_Var14 + 0x28),(TypeBase *)"%.*s: f%04x",str,pcVar10,
                          (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x38) + 0x48) - (int)uVar3),
                          uVar3,(ulong)*(uint *)(p_Var14 + 0x58));
          }
          PrintLeaveBlock(ctx);
          pTVar11 = (TypeBase *)pEVar8[1].source;
          goto LAB_00155338;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x28)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprShortFunctionOverloadSet()",str,pcVar10);
          name_04.end = "";
          name_04.begin = "functions";
          PrintEnterBlock(ctx,name_04,(TypeBase *)0x0);
          for (pp_Var13 = pEVar8[1]._vptr_ExprBase; pp_Var13 != (_func_int **)0x0;
              pp_Var13 = (_func_int **)pp_Var13[2]) {
            p_Var14 = *pp_Var13;
            uVar3 = *(undefined8 *)(*(long *)(p_Var14 + 0x38) + 0x40);
            PrintIndented(ctx,*(undefined8 *)(p_Var14 + 0x28),(TypeBase *)"%.*s: f%04x",str,pcVar10,
                          (ulong)(uint)(*(int *)(*(long *)(p_Var14 + 0x38) + 0x48) - (int)uVar3),
                          uVar3,(ulong)*(uint *)(p_Var14 + 0x58));
            PrintGraph(ctx,(ExprBase *)pp_Var13[1],"context");
          }
LAB_00155ccb:
          PrintLeaveBlock(ctx);
          goto LAB_00154941;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x29)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprFunctionCall()",str,pcVar10);
          PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"function");
          name_05.end = "";
          name_05.begin = "arguments";
          PrintEnterBlock(ctx,name_05,(TypeBase *)0x0);
          for (pEVar8 = *(ExprBase **)&pEVar8[1].typeID; pEVar8 != (ExprBase *)0x0;
              pEVar8 = pEVar8->next) {
            PrintGraph(ctx,pEVar8,"");
          }
          goto LAB_00155ccb;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x2a)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          pp_Var13 = pEVar8[1]._vptr_ExprBase;
          uVar3 = *(undefined8 *)(pp_Var13[3] + 0x10);
          uVar4 = *(undefined8 *)(pp_Var13[4] + 0x40);
          PrintIndented(ctx,pEVar8,(ExprBase *)"ExprAliasDefinition(%.*s %.*s: a%04x)",str,pcVar10,
                        (ulong)(uint)(*(int *)(pp_Var13[3] + 0x18) - (int)uVar3),uVar3,
                        (ulong)(uint)(*(int *)(pp_Var13[4] + 0x48) - (int)uVar4),uVar4,
                        (ulong)*(uint *)((long)pp_Var13 + 0x2c));
          return;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x2b)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          pp_Var13 = (_func_int **)pEVar8[1]._vptr_ExprBase[2];
          uVar15 = (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase + 3) - (int)pp_Var13);
          pcVar12 = "ExprClassPrototype(%.*s)";
          goto LAB_001546d4;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x2c)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          p_Var14 = pEVar8[1]._vptr_ExprBase[2];
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprGenericClassPrototype(%.*s)",str,pcVar10,
                          (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase + 3) - (int)p_Var14),
                          p_Var14);
          name_06.end = "";
          name_06.begin = "instances";
          PrintEnterBlock(ctx,name_06,(TypeBase *)0x0);
          for (pEVar8 = (ExprBase *)pEVar8[1]._vptr_ExprBase[0x19]; pEVar8 != (ExprBase *)0x0;
              pEVar8 = pEVar8->next) {
            PrintGraph(ctx,pEVar8,"");
          }
          goto LAB_00155ccb;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x2d)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          pp_Var13 = pEVar8[1]._vptr_ExprBase;
          p_Var14 = pp_Var13[0x23];
          p_Var6 = pp_Var13[2];
          uVar15 = (ulong)(uint)(*(int *)(pp_Var13 + 3) - (int)p_Var6);
          if (p_Var14 == (_func_int *)0x0) {
            pcVar12 = "\t";
            if (*(char *)(pp_Var13 + 0x22) != '\0') {
              pcVar12 = ", extendable";
            }
            PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprClassDefinition(%.*s%s)",str,pcVar10,uVar15,
                            p_Var6,pcVar12 + 1);
          }
          else {
            PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprClassDefinition(%.*s: %.*s)",str,pcVar10,
                            uVar15,p_Var6,
                            (ulong)(uint)(*(int *)(p_Var14 + 0x18) -
                                         (int)*(undefined8 *)(p_Var14 + 0x10)),
                            *(undefined8 *)(p_Var14 + 0x10));
          }
          name_08.end = "";
          name_08.begin = "variables";
          PrintEnterBlock(ctx,name_08,(TypeBase *)0x0);
          for (p_Var14 = pEVar8[1]._vptr_ExprBase[0xd]; p_Var14 != (_func_int *)0x0;
              p_Var14 = *(_func_int **)(p_Var14 + 0x18)) {
            lVar1 = *(long *)(p_Var14 + 8);
            uVar3 = *(undefined8 *)(*(long *)(lVar1 + 0x28) + 0x40);
            PrintIndented(ctx,*(undefined8 *)(lVar1 + 0x20),(TypeBase *)"%.*s: v%04x @ 0x%x",
                          (char *)0x0,0,
                          (ulong)(uint)(*(int *)(*(long *)(lVar1 + 0x28) + 0x48) - (int)uVar3),uVar3
                          ,(ulong)*(uint *)(lVar1 + 0x40),(ulong)*(uint *)(lVar1 + 0x3c));
          }
          PrintLeaveBlock(ctx);
          name_09.end = "";
          name_09.begin = "functions";
          PrintEnterBlock(ctx,name_09,(TypeBase *)0x0);
          for (pTVar11 = pEVar8[1].type; pTVar11 != (TypeBase *)0x0;
              pTVar11 = (TypeBase *)pTVar11->importModule) {
            PrintGraph(ctx,(ExprBase *)pTVar11,"");
          }
          PrintLeaveBlock(ctx);
          name_10.end = "";
          name_10.begin = "constants";
          PrintEnterBlock(ctx,name_10,(TypeBase *)0x0);
          for (p_Var14 = pEVar8[1]._vptr_ExprBase[0xf]; p_Var14 != (_func_int *)0x0;
              p_Var14 = *(_func_int **)(p_Var14 + 0x10)) {
            PrintGraph(ctx,*(ExprBase **)(p_Var14 + 8),*(InplaceStr *)(*(long *)p_Var14 + 0x40));
          }
          goto LAB_00155ccb;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x2e)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          p_Var14 = pEVar8[1]._vptr_ExprBase[2];
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprEnumDefinition(%.*s)",str,pcVar10,
                          (ulong)(uint)(*(int *)(pEVar8[1]._vptr_ExprBase + 3) - (int)p_Var14),
                          p_Var14);
          name_07.end = "";
          name_07.begin = "constants";
          PrintEnterBlock(ctx,name_07,(TypeBase *)0x0);
          for (p_Var14 = pEVar8[1]._vptr_ExprBase[0xf]; p_Var14 != (_func_int *)0x0;
              p_Var14 = *(_func_int **)(p_Var14 + 0x10)) {
            PrintGraph(ctx,*(ExprBase **)(p_Var14 + 8),*(InplaceStr *)(*(long *)p_Var14 + 0x40));
          }
          PrintLeaveBlock(ctx);
          PrintGraph(ctx,*(ExprBase **)&pEVar8[1].typeID,"toInt");
          pTVar11 = (TypeBase *)pEVar8[1].source;
          pcVar10 = "toEnum";
          goto LAB_00154939;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x2f)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          pcVar12 = "ExprIfElse()";
          goto LAB_00154ba8;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x30)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprFor()",str,pcVar10);
          PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"initializer");
          PrintGraph(ctx,*(ExprBase **)&pEVar8[1].typeID,"condition");
          PrintGraph(ctx,(ExprBase *)pEVar8[1].source,"increment");
          pTVar11 = pEVar8[1].type;
LAB_00155911:
          pcVar10 = "body";
          goto LAB_00154939;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x31)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprWhile()",str,pcVar10);
          PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"condition");
          pTVar11 = *(TypeBase **)&pEVar8[1].typeID;
          goto LAB_00155911;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x32)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprDoWhile()",str,pcVar10);
          PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"body");
          pTVar11 = *(TypeBase **)&pEVar8[1].typeID;
          pcVar10 = "condition";
          goto LAB_00154939;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x33)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 != (ExprBase *)0x0) {
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprSwitch()",str,pcVar10);
          PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"condition");
          name_11.end = "";
          name_11.begin = "cases";
          PrintEnterBlock(ctx,name_11,(TypeBase *)0x0);
          for (pEVar7 = *(ExprBase **)&pEVar8[1].typeID; pEVar7 != (ExprBase *)0x0;
              pEVar7 = pEVar7->next) {
            PrintGraph(ctx,pEVar7,"");
          }
          PrintLeaveBlock(ctx);
          name_12.end = "";
          name_12.begin = "blocks";
          PrintEnterBlock(ctx,name_12,(TypeBase *)0x0);
          for (pTVar11 = pEVar8[1].type; pTVar11 != (TypeBase *)0x0;
              pTVar11 = (TypeBase *)pTVar11->importModule) {
            PrintGraph(ctx,(ExprBase *)pTVar11,"");
          }
          PrintLeaveBlock(ctx);
          pTVar11 = *(TypeBase **)&pEVar8[1].listed;
          pcVar10 = "defaultBlock";
          goto LAB_00154939;
        }
        if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x34)) {
          pEVar8 = (ExprBase *)0x0;
        }
        if (pEVar8 == (ExprBase *)0x0) {
          if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x35))
          {
            pEVar8 = (ExprBase *)0x0;
          }
          if (pEVar8 != (ExprBase *)0x0) {
            uVar9 = *(uint *)&pEVar8->field_0x2c;
            pcVar12 = "ExprContinue(%d)";
            goto LAB_00155aa1;
          }
          if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x36))
          {
            pEVar8 = (ExprBase *)0x0;
          }
          if (pEVar8 == (ExprBase *)0x0) {
            if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x37)
               ) {
              pEVar8 = (ExprBase *)0x0;
            }
            if (pEVar8 != (ExprBase *)0x0) {
              PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprSequence()",str,pcVar10);
              if (pEVar8[1].typeID != 0) {
                uVar15 = 0;
                do {
                  PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase[uVar15],"");
                  uVar15 = uVar15 + 1;
                } while (uVar15 < pEVar8[1].typeID);
              }
              goto LAB_00154941;
            }
            if ((expression == (ExprBase *)0x0) || (pEVar8 = expression, expression->typeID != 0x38)
               ) {
              pEVar8 = (ExprBase *)0x0;
            }
            if (pEVar8 == (ExprBase *)0x0) {
              if (expression != (ExprBase *)0x0) {
                __assert_fail("!\"unknown type\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                              ,0x3de,
                              "void PrintGraph(ExpressionGraphContext &, ExprBase *, InplaceStr)");
              }
              PrintIndent(ctx);
              OutputContext::Print(ctx->output,str,(int)name.end - (int)name.begin);
              this = ctx->output;
              pcVar10 = ": null\n";
              uVar9 = 7;
              goto LAB_00154685;
            }
            PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprModule()",str,pcVar10);
            if (ctx->skipImported == false) {
              PrintGraph(ctx,(ScopeData *)pEVar8[1]._vptr_ExprBase,true);
            }
            PrintGraph(ctx,(ScopeData *)pEVar8[1]._vptr_ExprBase,false);
            name_13.end = "";
            name_13.begin = "definitions";
            PrintEnterBlock(ctx,name_13,(TypeBase *)0x0);
            if (*(int *)&pEVar8[1].source != 0) {
              uVar15 = 0;
              do {
                PrintGraph(ctx,*(ExprBase **)(*(long *)&pEVar8[1].typeID + uVar15 * 8),"");
                uVar15 = uVar15 + 1;
              } while (uVar15 < *(uint *)&pEVar8[1].source);
            }
            PrintLeaveBlock(ctx);
            ctx->skipFunctionDefinitions = true;
            name_14.end = "";
            name_14.begin = "setup";
            PrintEnterBlock(ctx,name_14,(TypeBase *)0x0);
            for (pEVar7 = (ExprBase *)pEVar8[7]._vptr_ExprBase; pEVar7 != (ExprBase *)0x0;
                pEVar7 = pEVar7->next) {
              PrintGraph(ctx,pEVar7,"");
            }
            PrintLeaveBlock(ctx);
            name_15.end = "";
            name_15.begin = "expressions";
            PrintEnterBlock(ctx,name_15,(TypeBase *)0x0);
            for (pSVar5 = pEVar8[7].source; pSVar5 != (SynBase *)0x0;
                pSVar5 = (SynBase *)(pSVar5->pos).begin) {
              PrintGraph(ctx,(ExprBase *)pSVar5,"");
            }
            goto LAB_00155ccb;
          }
          PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprBlock()",str,pcVar10);
          for (pEVar7 = (ExprBase *)pEVar8[1]._vptr_ExprBase; pEVar7 != (ExprBase *)0x0;
              pEVar7 = pEVar7->next) {
            PrintGraph(ctx,pEVar7,"");
          }
          goto LAB_00154d63;
        }
        uVar9 = *(uint *)&pEVar8->field_0x2c;
        pcVar12 = "ExprBreak(%d)";
LAB_00155aa1:
        PrintEnterBlock(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10,(ulong)uVar9);
        pTVar11 = (TypeBase *)pEVar8[1]._vptr_ExprBase;
        goto LAB_00154d68;
      }
      p_Var14 = pEVar8[1]._vptr_ExprBase[7];
      uVar3 = *(undefined8 *)(p_Var14 + 0x40);
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)"ExprFunctionAccess(%.*s: f%04x)",str,pcVar10,
                      (ulong)(uint)(*(int *)(p_Var14 + 0x48) - (int)uVar3),uVar3,
                      (ulong)*(uint *)(pEVar8[1]._vptr_ExprBase + 0xb));
      pTVar11 = *(TypeBase **)&pEVar8[1].typeID;
LAB_00155338:
      pcVar10 = "context";
    }
    else {
      pcVar12 = "ExprReturn()";
LAB_00154d28:
      PrintEnterBlock(ctx,pEVar8,(ExprBase *)pcVar12,str,pcVar10);
      PrintGraph(ctx,(ExprBase *)pEVar8[1]._vptr_ExprBase,"value");
      PrintGraph(ctx,*(ExprBase **)&pEVar8[1].typeID,"coroutineStateUpdate");
LAB_00154d63:
      pTVar11 = (TypeBase *)pEVar8[1].source;
LAB_00154d68:
      pcVar10 = "closures";
    }
  }
  else {
    pcVar12 = "))--";
    if ((char)pEVar8[1].typeID != '\0') {
      pcVar12 = "))++";
    }
    pcVar12 = pcVar12 + 2;
    node = "ExprPreModify(%s)";
LAB_00154a65:
    PrintEnterBlock(ctx,pEVar8,(ExprBase *)node,str,pcVar10,pcVar12);
LAB_0015492d:
    pTVar11 = (TypeBase *)pEVar8[1]._vptr_ExprBase;
    pcVar10 = "value";
  }
LAB_00154939:
  PrintGraph(ctx,(ExprBase *)pTVar11,pcVar10);
LAB_00154941:
  PrintLeaveBlock(ctx);
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ExprBase *expression, InplaceStr name)
{
	if(ctx.depth > 1024)
	{
		PrintIndented(ctx, name, expression, "{...}");
		return;
	}

	if(ExprError *node = getType<ExprError>(expression))
	{
		if(!node->values.empty())
		{
			PrintEnterBlock(ctx, name, node, "ExprError()");

			for(unsigned i = 0; i < node->values.size(); i++)
				PrintGraph(ctx, node->values[i], "");

			PrintLeaveBlock(ctx);
		}
		else
		{
			PrintIndented(ctx, name, node, "ExprError()");
		}
	}
	else if(ExprErrorTypeMemberAccess *node = getType<ExprErrorTypeMemberAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprErrorTypeMemberAccess(%.*s)", FMT_ISTR(node->value->name));
	}
	else if(ExprVoid *node = getType<ExprVoid>(expression))
	{
		PrintIndented(ctx, name, node, "ExprVoid()");
	}
	else if(ExprBoolLiteral *node = getType<ExprBoolLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprBoolLiteral(%s)", node->value ? "true" : "false");
	}
	else if(ExprCharacterLiteral *node = getType<ExprCharacterLiteral>(expression))
	{
		if((int)node->value < (int)' ')
			PrintIndented(ctx, name, node, "ExprCharacterLiteral(0x%02x)", node->value);
		else
			PrintIndented(ctx, name, node, "ExprCharacterLiteral(\'%c\')", node->value);
	}
	else if(ExprStringLiteral *node = getType<ExprStringLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprStringLiteral(\'%.*s\')", node->length, node->value);
	}
	else if(ExprIntegerLiteral *node = getType<ExprIntegerLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprIntegerLiteral(%lld)", node->value);
	}
	else if(ExprRationalLiteral *node = getType<ExprRationalLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprRationalLiteral(%f)", node->value);
	}
	else if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprTypeLiteral(%.*s)", FMT_ISTR(node->value->name));
	}
	else if(ExprNullptrLiteral *node = getType<ExprNullptrLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprNullptrLiteral()");
	}
	else if(ExprFunctionIndexLiteral *node = getType<ExprFunctionIndexLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprFunctionIndexLiteral(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPassthrough()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArray()");

		for(ExprBase *value = node->values.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPreModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPostModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		const char *category = "";

		switch(node->category)
		{
		case EXPR_CAST_NUMERICAL:
			category = "EXPR_CAST_NUMERICAL";
			break;
		case EXPR_CAST_PTR_TO_BOOL:
			category = "EXPR_CAST_PTR_TO_BOOL";
			break;
		case EXPR_CAST_UNSIZED_TO_BOOL:
			category = "EXPR_CAST_UNSIZED_TO_BOOL";
			break;
		case EXPR_CAST_FUNCTION_TO_BOOL:
			category = "EXPR_CAST_FUNCTION_TO_BOOL";
			break;
		case EXPR_CAST_NULL_TO_PTR:
			category = "EXPR_CAST_NULL_TO_PTR";
			break;
		case EXPR_CAST_NULL_TO_AUTO_PTR:
			category = "EXPR_CAST_NULL_TO_AUTO_PTR";
			break;
		case EXPR_CAST_NULL_TO_UNSIZED:
			category = "EXPR_CAST_NULL_TO_UNSIZED";
			break;
		case EXPR_CAST_NULL_TO_AUTO_ARRAY:
			category = "EXPR_CAST_NULL_TO_AUTO_ARRAY";
			break;
		case EXPR_CAST_NULL_TO_FUNCTION:
			category = "EXPR_CAST_NULL_TO_FUNCTION";
			break;
		case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
			category = "EXPR_CAST_ARRAY_PTR_TO_UNSIZED";
			break;
		case EXPR_CAST_PTR_TO_AUTO_PTR:
			category = "EXPR_CAST_PTR_TO_AUTO_PTR";
			break;
		case EXPR_CAST_AUTO_PTR_TO_PTR:
			category = "EXPR_CAST_AUTO_PTR_TO_PTR";
			break;
		case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
			category = "EXPR_CAST_UNSIZED_TO_AUTO_ARRAY";
			break;
		case EXPR_CAST_REINTERPRET:
			category = "EXPR_CAST_REINTERPRET";
			break;
		default:
			assert(!"unknown category");
		}

		PrintEnterBlock(ctx, name, node, "ExprTypeCast(%s)", category);

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprUnaryOp(%s)", GetOpName(node->op));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBinaryOp(%s)", GetOpName(node->op));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(ExprGetAddress *node = getType<ExprGetAddress>(expression))
	{
		PrintIndented(ctx, name, node, "ExprGetAddress(%.*s: v%04x)", FMT_ISTR(node->variable->variable->name->name), node->variable->variable->uniqueId);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprDereference()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprUnboxing()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprConditional()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprAssignment()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		if(node->member)
			PrintEnterBlock(ctx, name, node, "ExprMemberAccess(%.*s: v%04x)", FMT_ISTR(node->member->variable->name->name), node->member->variable->uniqueId);
		else
			PrintEnterBlock(ctx, name, node, "ExprMemberAccess(%%missing%%)");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArrayIndex()");

		PrintGraph(ctx, node->value, "value");
		PrintGraph(ctx, node->index, "index");

		PrintLeaveBlock(ctx);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprReturn()");

		PrintGraph(ctx, node->value, "value");

		PrintGraph(ctx, node->coroutineStateUpdate, "coroutineStateUpdate");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprYield()");

		PrintGraph(ctx, node->value, "value");

		PrintGraph(ctx, node->coroutineStateUpdate, "coroutineStateUpdate");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprVariableDefinition(%.*s %.*s: v%04x)", FMT_ISTR(node->variable->variable->type->name), FMT_ISTR(node->variable->variable->name->name), node->variable->variable->uniqueId);

		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprZeroInitialize()");

		PrintGraph(ctx, node->address, "address");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArraySetup()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprVariableDefinitions()");

		for(ExprBase *value = node->definitions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprVariableAccess(%.*s: v%04x)", FMT_ISTR(node->variable->name->name), node->variable->uniqueId);
	}
	else if(ExprFunctionContextAccess *node = getType<ExprFunctionContextAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprFunctionContextAccess(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		if(ctx.skipFunctionDefinitions)
		{
			PrintIndented(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x);", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);
			return;
		}

		if(node->function->isPrototype)
		{
			PrintEnterBlock(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x)", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);
			
			if(FunctionData *implementation = node->function->implementation)
				PrintIndented(ctx, InplaceStr("implementation"), implementation->type, "%.*s: f%04x", FMT_ISTR(implementation->name->name), implementation->uniqueId);

			PrintLeaveBlock(ctx);

			return;
		}

		ctx.skipFunctionDefinitions = true;

		PrintEnterBlock(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x)", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintGraph(ctx, node->contextArgument, "contextArgument");

		PrintEnterBlock(ctx, InplaceStr("arguments"), 0);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->coroutineStateRead, "coroutineStateRead");

		PrintEnterBlock(ctx, InplaceStr("expressions"), 0);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);

		ctx.skipFunctionDefinitions = false;
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprGenericFunctionPrototype(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintEnterBlock(ctx, InplaceStr("contextVariables"), 0);

		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionAccess(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintGraph(ctx, node->context, "context");

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionOverloadSet()");

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(FunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			PrintIndented(ctx, name, arg->function->type, "%.*s: f%04x", FMT_ISTR(arg->function->name->name), arg->function->uniqueId);

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->context, "context");

		PrintLeaveBlock(ctx);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprShortFunctionOverloadSet()");

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
		{
			PrintIndented(ctx, name, arg->function->type, "%.*s: f%04x", FMT_ISTR(arg->function->name->name), arg->function->uniqueId);

			PrintGraph(ctx, arg->context, "context");
		}

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionCall()");

		PrintGraph(ctx, node->function, "function");

		PrintEnterBlock(ctx, InplaceStr("arguments"), 0);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprAliasDefinition *node = getType<ExprAliasDefinition>(expression))
	{
		PrintIndented(ctx, name, node, "ExprAliasDefinition(%.*s %.*s: a%04x)", FMT_ISTR(node->alias->type->name), FMT_ISTR(node->alias->name->name), node->alias->uniqueId);
	}
	else if(ExprClassPrototype *node = getType<ExprClassPrototype>(expression))
	{
		PrintIndented(ctx, name, node, "ExprClassPrototype(%.*s)", FMT_ISTR(node->classType->name));
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprGenericClassPrototype(%.*s)", FMT_ISTR(node->genericProtoType->name));

		PrintEnterBlock(ctx, InplaceStr("instances"), 0);

		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		if(node->classType->baseClass)
			PrintEnterBlock(ctx, name, node, "ExprClassDefinition(%.*s: %.*s)", FMT_ISTR(node->classType->name), FMT_ISTR(node->classType->baseClass->name));
		else
			PrintEnterBlock(ctx, name, node, "ExprClassDefinition(%.*s%s)", FMT_ISTR(node->classType->name), node->classType->extendable ? " extendable" : "");

		PrintEnterBlock(ctx, InplaceStr("variables"), 0);

		for(MemberHandle *value = node->classType->members.head; value; value = value->next)
			PrintIndented(ctx, InplaceStr(), value->variable->type, "%.*s: v%04x @ 0x%x", FMT_ISTR(value->variable->name->name), value->variable->uniqueId, value->variable->offset);

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(ExprBase *value = node->functions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("constants"), 0);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			PrintGraph(ctx, value->value, value->name->name);

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprEnumDefinition(%.*s)", FMT_ISTR(node->enumType->name));

		PrintEnterBlock(ctx, InplaceStr("constants"), 0);

		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			PrintGraph(ctx, value->value, value->name->name);

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->toInt, "toInt");
		PrintGraph(ctx, node->toEnum, "toEnum");

		PrintLeaveBlock(ctx);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprIfElse()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFor()");

		PrintGraph(ctx, node->initializer, "initializer");
		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->increment, "increment");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprWhile()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprDoWhile()");

		PrintGraph(ctx, node->body, "body");
		PrintGraph(ctx, node->condition, "condition");

		PrintLeaveBlock(ctx);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprSwitch()");

		PrintGraph(ctx, node->condition, "condition");

		PrintEnterBlock(ctx, InplaceStr("cases"), 0);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("blocks"), 0);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->defaultBlock, "defaultBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBreak(%d)", node->depth);

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprContinue(%d)", node->depth);

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBlock()");

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprSequence()");

		for(unsigned i = 0; i < node->expressions.size(); i++)
			PrintGraph(ctx, node->expressions[i], "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprModule()");

		if(!ctx.skipImported)
			PrintGraph(ctx, node->moduleScope, true);

		PrintGraph(ctx, node->moduleScope, false);

		PrintEnterBlock(ctx, InplaceStr("definitions"), 0);

		for(unsigned i = 0; i < node->definitions.size(); i++)
			PrintGraph(ctx, node->definitions[i], "");

		PrintLeaveBlock(ctx);

		ctx.skipFunctionDefinitions = true;

		PrintEnterBlock(ctx, InplaceStr("setup"), 0);

		for(ExprBase *value = node->setup.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("expressions"), 0);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(!expression)
	{
		PrintIndent(ctx);

		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": null\n");
	}
	else
	{
		assert(!"unknown type");
	}
}